

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O2

MPP_RET jpege_init_v2(void *ctx,EncImplCfg *cfg)

{
  MppEncCfgSet *pMVar1;
  
  mpp_env_get_u32("jpege_debug",&jpege_debug,0);
  if (((byte)jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","enter ctx %p\n","jpege_init_v2",ctx);
  }
  pMVar1 = cfg->cfg;
  *(MppEncCfgSet **)ctx = pMVar1;
  cfg->coding = MPP_VIDEO_CodingMJPEG;
  (pMVar1->rc).fps_in_flex = 0;
  (pMVar1->rc).fps_in_num = 0x1e;
  (pMVar1->rc).fps_in_denom = 1;
  (pMVar1->rc).fps_out_flex = 0;
  (pMVar1->rc).fps_out_num = 0x1e;
  (pMVar1->rc).fps_out_denom = 1;
  (pMVar1->rc).rc_mode = MPP_ENC_RC_MODE_VBR;
  (pMVar1->codec).field_1.h264.stream_type = 10;
  if (((byte)jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","leave ctx %p\n","jpege_init_v2",ctx);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpege_init_v2(void *ctx, EncImplCfg *cfg)
{
    JpegeCtx *p = (JpegeCtx *)ctx;

    mpp_env_get_u32("jpege_debug", &jpege_debug, 0);
    jpege_dbg_func("enter ctx %p\n", ctx);

    p->cfg = cfg->cfg;

    mpp_assert(cfg->coding = MPP_VIDEO_CodingMJPEG);

    {
        /* init default rc config */
        MppEncRcCfg *rc = &p->cfg->rc;
        MppEncJpegCfg *jpeg_cfg = &p->cfg->codec.jpeg;

        rc->fps_in_flex = 0;
        rc->fps_in_num = 30;
        rc->fps_in_denom = 1;
        rc->fps_out_flex = 0;
        rc->fps_out_num = 30;
        rc->fps_out_denom = 1;
        rc->rc_mode = MPP_ENC_RC_MODE_VBR;
        /* init default quant */
        jpeg_cfg->quant = 10;
    }

    jpege_dbg_func("leave ctx %p\n", ctx);
    return MPP_OK;
}